

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseIdentifier(char *in,char *end,Text **id)

{
  bool bVar1;
  bool bVar2;
  Text *this;
  size_t len;
  char *start;
  size_t idLen;
  Text **id_local;
  char *end_local;
  char *in_local;
  
  *id = (Text *)0x0;
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    in_local = lookForNextToken<char>(in,end);
    bVar1 = isNumeric<char_const>(*in_local);
    if (!bVar1) {
      start = (char *)0x0;
      end_local = in_local;
      while( true ) {
        bVar2 = isSeparator<char>(*end_local);
        bVar1 = false;
        if (!bVar2) {
          bVar2 = isNewLine<char>(*end_local);
          bVar1 = false;
          if ((((!bVar2) && (bVar1 = false, end_local != end)) &&
              (bVar1 = false, *end_local != *Grammar::OpenPropertyToken)) &&
             (bVar1 = false, *end_local != *Grammar::ClosePropertyToken)) {
            bVar1 = *end_local != '$';
          }
        }
        if (!bVar1) break;
        end_local = end_local + 1;
        start = start + 1;
      }
      this = (Text *)operator_new(0x18);
      Text::Text(this,in_local,(size_t)start);
      *id = this;
      in_local = end_local;
    }
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseIdentifier( char *in, char *end, Text **id ) {
    *id = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    // ignore blanks
    in = lookForNextToken( in, end );

    // staring with a number is forbidden
    if( isNumeric<const char>( *in ) ) {
        return in;
    }

    // get size of id
    size_t idLen( 0 );
    char *start( in );
    while( !isSeparator( *in ) && 
            !isNewLine( *in ) && ( in != end ) && 
            *in != Grammar::OpenPropertyToken[ 0 ] &&
            *in != Grammar::ClosePropertyToken[ 0 ] && 
            *in != '$' ) {
        ++in;
        ++idLen;
    }

    const size_t len( idLen );
    *id = new Text( start, len );

    return in;
}